

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODTree.cpp
# Opt level: O0

void __thiscall
RandomForest::ODTree<double>::MultipleParameterBoostrapSampling
          (ODTree<double> *this,int oldNs,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_list)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,std::allocator<int>> *pvVar7;
  iterator iVar8;
  iterator iVar9;
  double dVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  double local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  double local_138;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  const_iterator local_108;
  int *local_100;
  int *local_f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  const_iterator local_e0;
  undefined1 local_d8 [8];
  shared_ptr<std::vector<int,_std::allocator<int>_>_> tempNegSampledList;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  const_iterator local_a8;
  int *local_a0;
  int *local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  const_iterator local_80;
  undefined1 local_68 [8];
  shared_ptr<std::vector<int,_std::allocator<int>_>_> tempPosSampledList;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> outputSampledList;
  double negLambda;
  double posLambda;
  double imbalanceRatio;
  int newNegN;
  int newPosN;
  int oldNegN;
  int oldPosN;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_list_local;
  int oldNs_local;
  ODTree<double> *this_local;
  
  peVar2 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->posTrainDataList);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(peVar2);
  peVar2 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->negTrainDataList);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(peVar2);
  UpdateTrainDataList(this,oldNs);
  peVar2 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->posTrainDataList);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(peVar2);
  peVar2 = std::
           __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->negTrainDataList);
  sVar6 = std::vector<int,_std::allocator<int>_>::size(peVar2);
  dVar10 = (double)(int)sVar6 / (double)(int)sVar5;
  if (this->samplingType == DownSamplingMajority) {
    local_138 = dVar10;
    if (1.0 <= dVar10) {
      local_138 = 1.0;
    }
    negLambda = local_138;
    if (dVar10 < 1.0) {
      local_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
    }
    else {
      local_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(1.0 / dVar10);
    }
    outputSampledList.
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_140;
  }
  else {
    local_148 = dVar10;
    if (dVar10 < 1.0) {
      local_148 = 1.0;
    }
    negLambda = local_148;
    if (dVar10 < 1.0) {
      local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(1.0 / dVar10);
    }
    else {
      local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
    }
    outputSampledList.
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_150;
  }
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  std::shared_ptr<std::vector<int,std::allocator<int>>>::
  shared_ptr<std::vector<int,std::allocator<int>>,void>
            ((shared_ptr<std::vector<int,std::allocator<int>>> *)
             &tempPosSampledList.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if ((int)sVar3 < (int)sVar5) {
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
              ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_68);
    GetPosNewAddedSampledList
              (this,(int)sVar3,negLambda,
               (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_68);
    pvVar7 = (vector<int,std::allocator<int>> *)
             std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->posSampledList);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->posSampledList);
    local_88._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(peVar2);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_80,
               &local_88);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    local_90._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(peVar2);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    local_98 = (int *)std::vector<int,_std::allocator<int>_>::end(peVar2);
    local_a0 = (int *)std::vector<int,std::allocator<int>>::
                      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                (pvVar7,local_80,local_90,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_98);
    p_Var1 = &tempPosSampledList.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    pvVar7 = (vector<int,std::allocator<int>> *)
             std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p_Var1);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p_Var1);
    local_b0._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(peVar2);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_a8,
               &local_b0);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(peVar2);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(peVar2);
    tempNegSampledList.
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::vector<int,std::allocator<int>>::
         insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                   (pvVar7,local_a8,
                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                    iVar8._M_current,
                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                    iVar9._M_current);
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
              ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_68);
  }
  if ((int)sVar4 < (int)sVar6) {
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
              ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_d8);
    GetNegNewAddedSampledList
              (this,(int)sVar4,
               (double)outputSampledList.
                       super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,
               (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_d8);
    pvVar7 = (vector<int,std::allocator<int>> *)
             std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->negSampledList);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->negSampledList);
    local_e8._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(peVar2);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_e0,
               &local_e8);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    local_f0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(peVar2);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    local_f8 = (int *)std::vector<int,_std::allocator<int>_>::end(peVar2);
    local_100 = (int *)std::vector<int,std::allocator<int>>::
                       insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                 (pvVar7,local_e0,local_f0,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  )local_f8);
    p_Var1 = &tempPosSampledList.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    pvVar7 = (vector<int,std::allocator<int>> *)
             std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p_Var1);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p_Var1);
    local_110._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(peVar2);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_108,
               &local_110);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    iVar8 = std::vector<int,_std::allocator<int>_>::begin(peVar2);
    peVar2 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    iVar9 = std::vector<int,_std::allocator<int>_>::end(peVar2);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              (pvVar7,local_108,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar8._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current);
    std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
              ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_d8);
  }
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::operator=
            (o_list,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)
                    &tempPosSampledList.
                     super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)
             &tempPosSampledList.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void RandomForest::ODTree<T>::MultipleParameterBoostrapSampling(int oldNs, std::shared_ptr<std::vector<int> > *o_list)
{
    int oldPosN=posTrainDataList->size();
    int oldNegN=negTrainDataList->size();
    UpdateTrainDataList(oldNs);
    int newPosN=posTrainDataList->size();
    int newNegN=negTrainDataList->size();

    double imbalanceRatio=static_cast<double>(newNegN)/newPosN;
    double posLambda, negLambda;
    if(samplingType==DownSamplingMajority)
    {
        posLambda=imbalanceRatio>=1.0 ? 1.0:imbalanceRatio;
        negLambda=imbalanceRatio>=1.0 ? 1.0/imbalanceRatio:1.0;
    }
    else{
        posLambda=imbalanceRatio>=1.0 ? imbalanceRatio:1.0;
        negLambda=imbalanceRatio>=1.0 ? 1.0:1.0/imbalanceRatio;
    }
    
    std::shared_ptr<std::vector<int> > outputSampledList(new std::vector<int>);
    if(newPosN>oldPosN)
    {
        std::shared_ptr<std::vector<int> > tempPosSampledList;
        GetPosNewAddedSampledList(oldPosN, posLambda, &tempPosSampledList);
        posSampledList->insert(posSampledList->end(), tempPosSampledList->begin(), tempPosSampledList->end());
        outputSampledList->insert(outputSampledList->end(), tempPosSampledList->begin(), tempPosSampledList->end());
    }
    if(newNegN>oldNegN)
    {
        std::shared_ptr<std::vector<int> > tempNegSampledList;
        GetNegNewAddedSampledList(oldNegN, negLambda, &tempNegSampledList);
        negSampledList->insert(negSampledList->end(), tempNegSampledList->begin(), tempNegSampledList->end());
        outputSampledList->insert(outputSampledList->end(), tempNegSampledList->begin(), tempNegSampledList->end());
    }
    *o_list=outputSampledList;
}